

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O1

void __thiscall
wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::propagateBack
          (CallGraphPropertyAnalysis<Info> *this,function<bool_(const_Info_&)> *hasProperty,
          function<bool_(const_Info_&)> *canHaveProperty,function<void_(Info_&)> *addProperty,
          function<void_(const_Info_&,_wasm::Function_*)> *logVisit,NonDirectCalls nonDirectCalls)

{
  pointer puVar1;
  bool bVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  Map *pMVar5;
  pointer puVar6;
  _Rb_tree_header *p_Var7;
  undefined1 auStack_f8 [8];
  UniqueDeferredQueue<wasm::Function_*> work;
  Function *local_68;
  Function *caller;
  NonDirectCalls local_54;
  _Any_data *local_50;
  _Any_data *local_48;
  _Head_base<0UL,_wasm::Function_*,_false> local_40;
  Function *func;
  
  work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_f8 = (undefined1  [8])0x0;
  work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  caller = (Function *)logVisit;
  local_54 = nonDirectCalls;
  local_50 = (_Any_data *)hasProperty;
  local_48 = (_Any_data *)addProperty;
  std::_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::_M_initialize_map
            ((_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_f8,0);
  work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)&work.count._M_h._M_rehash_policy._M_next_resize;
  work.count._M_h._M_buckets = (__buckets_ptr)0x1;
  work.count._M_h._M_bucket_count = 0;
  work.count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  work.count._M_h._M_element_count._0_4_ = 0x3f800000;
  work.count._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  work.count._M_h._M_rehash_policy._4_4_ = 0;
  work.count._M_h._M_rehash_policy._M_next_resize = 0;
  puVar6 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar1) {
    pMVar5 = &this->map;
    do {
      func = (puVar6->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pmVar3 = std::
               map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
               ::operator[](pMVar5,&func);
      if (*(long *)(local_50 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      bVar2 = (**(code **)(local_50->_M_pod_data + 0x18))(local_50,pmVar3);
      if (bVar2) {
LAB_00a13200:
        func = (puVar6->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        pmVar3 = std::
                 map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                 ::operator[](pMVar5,&func);
        if (*(long *)(local_48 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        (**(code **)(local_48->_M_pod_data + 0x18))(local_48,pmVar3);
        UniqueDeferredQueue<wasm::Function_*>::push
                  ((UniqueDeferredQueue<wasm::Function_*> *)auStack_f8,
                   (puVar6->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      }
      else if (local_54 == NonDirectCallsHaveProperty) {
        local_40._M_head_impl =
             (puVar6->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        pmVar3 = std::
                 map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                 ::operator[](pMVar5,&local_40._M_head_impl);
        if ((pmVar3->super_FunctionInfo).hasNonDirectCall != false) goto LAB_00a13200;
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  pMVar5 = &this->map;
  do {
    do {
      if (((long)((long)work.data.c.
                        super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_first -
                 work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                 _M_impl.super__Deque_impl_data._M_map_size) >> 3) +
          ((long)work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_node -
           (long)work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur >> 3) +
          ((((ulong)((long)work.data.c.
                           super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                           _M_impl.super__Deque_impl_data._M_finish._M_last -
                    (long)work.data.c.
                          super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
          (ulong)(work.data.c.super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x40 ==
          0) {
        std::
        _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)((long)&work.data.c.
                                 super__Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                 ._M_impl.super__Deque_impl_data._M_finish + 0x18));
        std::_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Deque_base
                  ((_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_f8);
        return;
      }
      local_40._M_head_impl =
           UniqueDeferredQueue<wasm::Function_*>::pop
                     ((UniqueDeferredQueue<wasm::Function_*> *)auStack_f8);
      pmVar3 = std::
               map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
               ::operator[](pMVar5,&local_40._M_head_impl);
      p_Var4 = (pmVar3->super_FunctionInfo).calledBy._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left;
      p_Var7 = &(pmVar3->super_FunctionInfo).calledBy._M_t._M_impl.super__Rb_tree_header;
    } while ((_Rb_tree_header *)p_Var4 == p_Var7);
    do {
      local_68 = *(Function **)(p_Var4 + 1);
      pmVar3 = std::
               map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
               ::operator[](pMVar5,&local_68);
      if ((canHaveProperty->super__Function_base)._M_manager == (_Manager_type)0x0)
      goto LAB_00a133e7;
      bVar2 = (*canHaveProperty->_M_invoker)((_Any_data *)canHaveProperty,pmVar3);
      if (bVar2) {
        pmVar3 = std::
                 map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                 ::operator[](pMVar5,&local_68);
        func = local_40._M_head_impl;
        if (*(long *)&(caller->super_Importable).super_Named.hasExplicitName == 0) {
LAB_00a133e7:
          std::__throw_bad_function_call();
        }
        (*(code *)(caller->super_Importable).module.super_IString.str._M_len)(caller,pmVar3,&func);
        pmVar3 = std::
                 map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                 ::operator[](pMVar5,&local_68);
        if (*(long *)(local_50 + 1) == 0) goto LAB_00a133e7;
        bVar2 = (**(code **)(local_50->_M_pod_data + 0x18))(local_50,pmVar3);
        if (!bVar2) {
          pmVar3 = std::
                   map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                   ::operator[](pMVar5,&local_68);
          if (*(long *)(local_48 + 1) == 0) goto LAB_00a133e7;
          (**(code **)(local_48->_M_pod_data + 0x18))(local_48,pmVar3);
          UniqueDeferredQueue<wasm::Function_*>::push
                    ((UniqueDeferredQueue<wasm::Function_*> *)auStack_f8,local_68);
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var7);
  } while( true );
}

Assistant:

void propagateBack(std::function<bool(const T&)> hasProperty,
                     std::function<bool(const T&)> canHaveProperty,
                     std::function<void(T&)> addProperty,
                     std::function<void(const T&, Function*)> logVisit,
                     NonDirectCalls nonDirectCalls) {
    // The work queue contains items we just learned can change the state.
    UniqueDeferredQueue<Function*> work;
    for (auto& func : wasm.functions) {
      if (hasProperty(map[func.get()]) ||
          (nonDirectCalls == NonDirectCallsHaveProperty &&
           map[func.get()].hasNonDirectCall)) {
        addProperty(map[func.get()]);
        work.push(func.get());
      }
    }
    while (!work.empty()) {
      auto* func = work.pop();
      for (auto* caller : map[func].calledBy) {
        // Skip functions forbidden from getting this property.
        if (!canHaveProperty(map[caller])) {
          continue;
        }
        // Log now, even if the function already has the property.
        logVisit(map[caller], func);
        // If we don't already have the property, then add it now, and propagate
        // further.
        if (!hasProperty(map[caller])) {
          addProperty(map[caller]);
          work.push(caller);
        }
      }
    }
  }